

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_set_format.c
# Opt level: O0

void test_read_append_filter_program(void)

{
  wchar_t wVar1;
  archive *paVar2;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  archive *a;
  archive_entry *ae;
  archive *in_stack_00000018;
  void *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  archive *paVar3;
  wchar_t in_stack_fffffffffffffff8;
  wchar_t in_stack_fffffffffffffffc;
  
  wVar1 = canGzip();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_set_format.c"
                   ,L'¶');
    test_skipping("Can\'t run gzip program on this platform");
  }
  else {
    paVar2 = archive_read_new();
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8,(char *)paVar2,in_stack_ffffffffffffffe8);
    archive_read_set_format(in_stack_00000018,ae._4_4_);
    assertion_assert((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8,(char *)paVar2,in_stack_ffffffffffffffe8);
    archive_read_append_filter_program(paVar2,in_stack_ffffffffffffffe8);
    paVar3 = paVar2;
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x1c7d4f,in_stack_00000020);
    archive_read_open_memory(paVar3,paVar2,0x1c7d65);
    paVar2 = paVar3;
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3
                        ,(longlong)paVar3,(char *)0x1c7d94,in_stack_00000020);
    archive_read_next_header(paVar2,(archive_entry **)paVar3);
    paVar3 = paVar2;
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar2
                        ,(longlong)paVar2,(char *)0x1c7dd2,in_stack_00000020);
    archive_filter_code(paVar3,(int)((ulong)paVar2 >> 0x20));
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3
                        ,0,(char *)0x1c7e10,in_stack_00000020);
    archive_format(paVar3);
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3
                        ,0,(char *)0x1c7e4c,in_stack_00000020);
    archive_read_close((archive *)0x1c7e56);
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3
                        ,(longlong)paVar3,(char *)0x1c7e85,in_stack_00000020);
    archive_read_free((archive *)0x1c7e8f);
    assertion_equal_int((char *)a,unaff_retaddr_00,
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),(char *)paVar3
                        ,0,(char *)0x1c7ebd,in_stack_00000020);
  }
  return;
}

Assistant:

DEFINE_TEST(test_read_append_filter_program)
{
  struct archive_entry *ae;
  struct archive *a;

  if (!canGzip()) {
    skipping("Can't run gzip program on this platform");
    return;
  }
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_set_format(a, ARCHIVE_FORMAT_TAR));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_append_filter_program(a, "gzip -d"));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_open_memory(a, archive, sizeof(archive)));
  assertEqualIntA(a, ARCHIVE_OK,
      archive_read_next_header(a, &ae));
  assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_PROGRAM);
  assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}